

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::FillFractionals
               (uint64_t fractionals,int exponent,int fractional_count,Vector<char> buffer,
               int *length,int *decimal_point)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  uint64_t in_RDI;
  int in_R8D;
  int *in_R9;
  int digit_1;
  int i_1;
  int point_1;
  UInt128 fractionals128;
  int digit;
  int i;
  int point;
  int *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff86;
  char in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int local_60;
  int local_5c;
  UInt128 local_58;
  char *local_48;
  int local_34;
  int local_30;
  int local_2c;
  int *local_28;
  int local_20;
  int local_1c;
  ulong local_18;
  Vector<char> local_10;
  
  local_28 = in_R9;
  local_20 = in_EDX;
  local_10.start_ = in_RCX;
  if (-in_ESI < 0x41) {
    local_2c = -in_ESI;
    local_30 = 0;
    for (local_18 = in_RDI; (local_30 < local_20 && (local_18 != 0));
        local_18 = local_18 - ((long)local_34 << ((byte)local_2c & 0x3f))) {
      local_18 = local_18 * 5;
      local_2c = local_2c + -1;
      uVar3 = local_18 >> ((byte)local_2c & 0x3f);
      local_34 = (int)uVar3;
      in_stack_ffffffffffffff87 = (char)uVar3 + '0';
      pcVar4 = Vector<char>::operator[](&local_10,*local_28);
      *pcVar4 = in_stack_ffffffffffffff87;
      *local_28 = *local_28 + 1;
      local_30 = local_30 + 1;
    }
    if ((local_18 != 0) && ((local_18 >> ((char)local_2c - 1U & 0x3f) & 1) == 1)) {
      local_48 = local_10.start_;
      buffer_00._8_8_ = in_stack_ffffffffffffff90;
      buffer_00.start_ = in_stack_ffffffffffffff88;
      RoundUp(buffer_00,
              (int *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
              in_stack_ffffffffffffff78);
    }
  }
  else {
    local_1c = in_ESI;
    local_10.length_ = in_R8D;
    UInt128::UInt128(&local_58,in_RDI,0);
    UInt128::Shift(&local_58,-0x40 - local_1c);
    local_5c = 0x80;
    local_60 = 0;
    while ((local_60 < local_20 && (bVar1 = UInt128::IsZero(&local_58), !bVar1))) {
      UInt128::Multiply(&local_58,5);
      local_5c = local_5c + -1;
      iVar2 = UInt128::DivModPowerOf2(&local_58,local_5c);
      in_stack_ffffffffffffff86 = (char)iVar2 + '0';
      pcVar4 = Vector<char>::operator[](&local_10,*local_28);
      *pcVar4 = in_stack_ffffffffffffff86;
      *local_28 = *local_28 + 1;
      local_60 = local_60 + 1;
    }
    iVar2 = UInt128::BitAt(&local_58,local_5c + -1);
    if (iVar2 == 1) {
      buffer_01._12_4_ = local_10._12_4_;
      buffer_01.length_ = local_10.length_;
      buffer_01.start_ = local_10.start_;
      RoundUp(buffer_01,
              (int *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
              in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

static void FillFractionals(uint64_t fractionals, int exponent,
                            int fractional_count, Vector<char> buffer,
                            int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(-128 <= exponent && exponent <= 0);
  // 'fractionals' is a fixed-point number, with binary point at bit
  // (-exponent). Inside the function the non-converted remainder of fractionals
  // is a fixed-point number, with binary point at bit 'point'.
  if (-exponent <= 64) {
    // One 64 bit number is sufficient.
    DOUBLE_CONVERSION_ASSERT(fractionals >> 56 == 0);
    int point = -exponent;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals == 0) break;
      // Instead of multiplying by 10 we multiply by 5 and adjust the point
      // location. This way the fractionals variable will not overflow.
      // Invariant at the beginning of the loop: fractionals < 2^point.
      // Initially we have: point <= 64 and fractionals < 2^56
      // After each iteration the point is decremented by one.
      // Note that 5^3 = 125 < 128 = 2^7.
      // Therefore three iterations of this loop will not overflow fractionals
      // (even without the subtraction at the end of the loop body). At this
      // time point will satisfy point <= 61 and therefore fractionals < 2^point
      // and any further multiplication of fractionals by 5 will not overflow.
      fractionals *= 5;
      point--;
      int digit = static_cast<int>(fractionals >> point);
      DOUBLE_CONVERSION_ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
      fractionals -= static_cast<uint64_t>(digit) << point;
    }
    // If the first bit after the point is set we have to round up.
    DOUBLE_CONVERSION_ASSERT(fractionals == 0 || point - 1 >= 0);
    if ((fractionals != 0) && ((fractionals >> (point - 1)) & 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  } else {  // We need 128 bits.
    DOUBLE_CONVERSION_ASSERT(64 < -exponent && -exponent <= 128);
    UInt128 fractionals128 = UInt128(fractionals, 0);
    fractionals128.Shift(-exponent - 64);
    int point = 128;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals128.IsZero()) break;
      // As before: instead of multiplying by 10 we multiply by 5 and adjust the
      // point location.
      // This multiplication will not overflow for the same reasons as before.
      fractionals128.Multiply(5);
      point--;
      int digit = fractionals128.DivModPowerOf2(point);
      DOUBLE_CONVERSION_ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
    }
    if (fractionals128.BitAt(point - 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  }
}